

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O2

btree_result btree_iterator_free(btree_iterator *it)

{
  btree_print_func *pbVar1;
  ulong uVar2;
  
  pbVar1 = ((it->btree).kv_ops)->free_kv_var;
  if (pbVar1 != (btree_print_func *)0x0) {
    (*pbVar1)(&it->btree,it->curkey,(void *)0x0);
  }
  free(it->curkey);
  free(it->bid);
  free(it->idx);
  for (uVar2 = 0; uVar2 < (it->btree).height; uVar2 = uVar2 + 1) {
    if (it->node[uVar2] != (bnode *)0x0) {
      free(it->addr[uVar2]);
    }
  }
  free(it->node);
  free(it->addr);
  return BTREE_RESULT_SUCCESS;
}

Assistant:

btree_result btree_iterator_free(struct btree_iterator *it)
{
    int i;
    if (it->btree.kv_ops->free_kv_var) {
        it->btree.kv_ops->free_kv_var(&it->btree, it->curkey, NULL);
    }
    mempool_free(it->curkey);
    mempool_free(it->bid);
    mempool_free(it->idx);
    for (i=0;i<it->btree.height;++i){
        if (it->node[i]) mempool_free(it->addr[i]);
    }
    mempool_free(it->node);
    mempool_free(it->addr);
    return BTREE_RESULT_SUCCESS;
}